

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArgument
          (CommandLineInterface *this,char *arg,string *name,string *value)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  char *local_40;
  char *equals_pos;
  string *psStack_30;
  bool parsed_value;
  string *value_local;
  string *name_local;
  char *arg_local;
  CommandLineInterface *this_local;
  
  equals_pos._7_1_ = 0;
  psStack_30 = value;
  value_local = name;
  name_local = (string *)arg;
  arg_local = (char *)this;
  if (*arg == '-') {
    if (arg[1] == '-') {
      local_40 = strchr(arg,0x3d);
      psVar1 = name_local;
      if (local_40 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)value_local,(char *)name_local);
      }
      else {
        uVar4 = (long)local_40 - (long)name_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,(char *)psVar1,uVar4,&local_61);
        std::__cxx11::string::operator=((string *)value_local,local_60);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        std::__cxx11::string::operator=((string *)psStack_30,local_40 + 1);
        equals_pos._7_1_ = 1;
      }
    }
    else if (arg[1] == '\0') {
      std::__cxx11::string::clear();
      std::__cxx11::string::operator=((string *)psStack_30,(char *)name_local);
      equals_pos._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,arg,2,&local_99);
      std::__cxx11::string::operator=((string *)value_local,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::string::operator=((string *)psStack_30,&name_local->field_0x2);
      bVar2 = std::__cxx11::string::empty();
      equals_pos._7_1_ = (bVar2 ^ 0xff) & 1;
    }
  }
  else {
    std::__cxx11::string::clear();
    equals_pos._7_1_ = 1;
    std::__cxx11::string::operator=((string *)psStack_30,(char *)name_local);
  }
  if ((equals_pos._7_1_ & 1) == 0) {
    bVar3 = std::operator==(value_local,"-h");
    if (((((bVar3) || (bVar3 = std::operator==(value_local,"--help"), bVar3)) ||
         (bVar3 = std::operator==(value_local,"--disallow_services"), bVar3)) ||
        ((((bVar3 = std::operator==(value_local,"--include_imports"), bVar3 ||
           (bVar3 = std::operator==(value_local,"--include_source_info"), bVar3)) ||
          ((bVar3 = std::operator==(value_local,"--retain_options"), bVar3 ||
           ((bVar3 = std::operator==(value_local,"--version"), bVar3 ||
            (bVar3 = std::operator==(value_local,"--decode_raw"), bVar3)))))) ||
         (bVar3 = std::operator==(value_local,"--notices"), bVar3)))) ||
       ((((bVar3 = std::operator==(value_local,"--experimental_editions"), bVar3 ||
          (bVar3 = std::operator==(value_local,"--print_free_field_numbers"), bVar3)) ||
         (bVar3 = std::operator==(value_local,"--experimental_allow_proto3_optional"), bVar3)) ||
        ((bVar3 = std::operator==(value_local,"--deterministic_output"), bVar3 ||
         (bVar3 = std::operator==(value_local,"--fatal_warnings"), bVar3)))))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::ParseArgument(const char* arg, std::string* name,
                                         std::string* value) {
  bool parsed_value = false;

  if (arg[0] != '-') {
    // Not a flag.
    name->clear();
    parsed_value = true;
    *value = arg;
  } else if (arg[1] == '-') {
    // Two dashes:  Multi-character name, with '=' separating name and
    //   value.
    const char* equals_pos = strchr(arg, '=');
    if (equals_pos != nullptr) {
      *name = std::string(arg, equals_pos - arg);
      *value = equals_pos + 1;
      parsed_value = true;
    } else {
      *name = arg;
    }
  } else {
    // One dash:  One-character name, all subsequent characters are the
    //   value.
    if (arg[1] == '\0') {
      // arg is just "-".  We treat this as an input file, except that at
      // present this will just lead to a "file not found" error.
      name->clear();
      *value = arg;
      parsed_value = true;
    } else {
      *name = std::string(arg, 2);
      *value = arg + 2;
      parsed_value = !value->empty();
    }
  }

  // Need to return true iff the next arg should be used as the value for this
  // one, false otherwise.

  if (parsed_value) {
    // We already parsed a value for this flag.
    return false;
  }

  if (*name == "-h" || *name == "--help" || *name == "--disallow_services" ||
      *name == "--include_imports" || *name == "--include_source_info" ||
      *name == "--retain_options" || *name == "--version" ||
      *name == "--decode_raw" ||
      *name == "--notices" ||
      *name == "--experimental_editions" ||
      *name == "--print_free_field_numbers" ||
      *name == "--experimental_allow_proto3_optional" ||
      *name == "--deterministic_output" || *name == "--fatal_warnings") {
    // HACK:  These are the only flags that don't take a value.
    //   They probably should not be hard-coded like this but for now it's
    //   not worth doing better.
    return false;
  }

  // Next argument is the flag value.
  return true;
}